

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void init_inter_block_params
               (InterPredParams *inter_pred_params,int block_width,int block_height,int pix_row,
               int pix_col,int subsampling_x,int subsampling_y,int bit_depth,int use_hbd_buf,
               int is_intrabc)

{
  int subsampling_x_local;
  int pix_col_local;
  int pix_row_local;
  int block_height_local;
  int block_width_local;
  InterPredParams *inter_pred_params_local;
  
  inter_pred_params->block_width = block_width;
  inter_pred_params->block_height = block_height;
  inter_pred_params->pix_row = pix_row;
  inter_pred_params->pix_col = pix_col;
  inter_pred_params->subsampling_x = subsampling_x;
  inter_pred_params->subsampling_y = subsampling_y;
  inter_pred_params->bit_depth = bit_depth;
  inter_pred_params->use_hbd_buf = use_hbd_buf;
  inter_pred_params->is_intrabc = is_intrabc;
  inter_pred_params->mode = TRANSLATION_PRED;
  inter_pred_params->comp_mode = UNIFORM_SINGLE;
  inter_pred_params->top = ((0x120 >> ((byte)subsampling_y & 0x1f)) + -4) * -0x400;
  inter_pred_params->left = ((0x120 >> ((byte)subsampling_x & 0x1f)) + -4) * -0x400;
  return;
}

Assistant:

static inline void init_inter_block_params(InterPredParams *inter_pred_params,
                                           int block_width, int block_height,
                                           int pix_row, int pix_col,
                                           int subsampling_x, int subsampling_y,
                                           int bit_depth, int use_hbd_buf,
                                           int is_intrabc) {
  inter_pred_params->block_width = block_width;
  inter_pred_params->block_height = block_height;
  inter_pred_params->pix_row = pix_row;
  inter_pred_params->pix_col = pix_col;
  inter_pred_params->subsampling_x = subsampling_x;
  inter_pred_params->subsampling_y = subsampling_y;
  inter_pred_params->bit_depth = bit_depth;
  inter_pred_params->use_hbd_buf = use_hbd_buf;
  inter_pred_params->is_intrabc = is_intrabc;
  inter_pred_params->mode = TRANSLATION_PRED;
  inter_pred_params->comp_mode = UNIFORM_SINGLE;
  inter_pred_params->top = -AOM_LEFT_TOP_MARGIN_SCALED(subsampling_y);
  inter_pred_params->left = -AOM_LEFT_TOP_MARGIN_SCALED(subsampling_x);
}